

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffnchk(fitsfile *fptr,int *status)

{
  long lVar1;
  long lVar2;
  int iVar3;
  size_t sVar4;
  int *in_RSI;
  int *in_RDI;
  char block [2881];
  int nullpos;
  int length;
  LONGLONG bytepos;
  long nblock;
  long ii;
  char acStackY_b88 [8];
  int *in_stack_fffffffffffff480;
  int in_stack_fffffffffffff48c;
  LONGLONG in_stack_fffffffffffff490;
  fitsfile *in_stack_fffffffffffff498;
  int *in_stack_fffffffffffff4c0;
  void *in_stack_fffffffffffff4c8;
  LONGLONG in_stack_fffffffffffff4d0;
  fitsfile *in_stack_fffffffffffff4d8;
  int *in_stack_fffffffffffff4e0;
  int *in_stack_fffffffffffff4e8;
  int in_stack_fffffffffffff4f4;
  fitsfile *in_stack_fffffffffffff4f8;
  long local_20;
  int local_4;
  
  if (*in_RSI < 1) {
    if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      ffmahd(in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f4,in_stack_fffffffffffff4e8,
             in_stack_fffffffffffff4e0);
    }
    if (*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) {
      local_4 = 0;
    }
    else {
      lVar1 = *(long *)(*(long *)(in_RDI + 2) + 0x88);
      lVar2 = *(long *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) +
                       (long)*(int *)(*(long *)(in_RDI + 2) + 0x54) * 8);
      ffmbyt(in_stack_fffffffffffff498,in_stack_fffffffffffff490,in_stack_fffffffffffff48c,
             in_stack_fffffffffffff480);
      for (local_20 = 0; local_20 < (lVar1 - lVar2) / 0xb40; local_20 = local_20 + 1) {
        iVar3 = ffgbyt(in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8
                       ,in_stack_fffffffffffff4c0);
        if (0 < iVar3) {
          return 0;
        }
        sVar4 = strlen(acStackY_b88);
        if ((int)sVar4 != 0xb40) {
          return (int)local_20 * 0xb40 + (int)sVar4 + 1;
        }
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = *in_RSI;
  }
  return local_4;
}

Assistant:

int ffnchk(fitsfile *fptr,  /* I - FITS file pointer                     */
           int *status)     /* IO - error status                         */
/*
  function returns the position of the first null character (ASCII 0), if
  any, in the current header.  Null characters are illegal, but the other
  CFITSIO routines that read the header will not detect this error, because
  the null gets interpreted as a normal end of string character.
*/
{
    long ii, nblock;
    LONGLONG bytepos;
    int length, nullpos;
    char block[2881];
    
    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
    {
        return(0);  /* Don't check a file that is just being created.  */
                    /* It cannot contain nulls since CFITSIO wrote it. */
    }
    else
    {
        /* calculate number of blocks in the header */
        nblock = (long) (( (fptr->Fptr)->datastart - 
                   (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] ) / 2880);
    }

    bytepos = (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu];
    ffmbyt(fptr, bytepos, REPORT_EOF, status);  /* move to read pos. */

    block[2880] = '\0';
    for (ii = 0; ii < nblock; ii++)
    {
        if (ffgbyt(fptr, 2880, block, status) > 0)
            return(0);   /* read error of some sort */

        length = strlen(block);
        if (length != 2880)
        {
            nullpos = (ii * 2880) + length + 1;
            return(nullpos);
        }
    }

    return(0);
}